

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TopKLayerParams::SerializeWithCachedSizes
          (TopKLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  uint64 uVar3;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TopKLayerParams *this_local;
  
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  uVar3 = k(this);
  if (uVar3 != 0) {
    uVar3 = k(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  bVar1 = usebottomk(this);
  if (bVar1) {
    bVar1 = usebottomk(this);
    google::protobuf::internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  return;
}

Assistant:

void TopKLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TopKLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // uint64 K = 2;
  if (this->k() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->k(), output);
  }

  // bool useBottomK = 3;
  if (this->usebottomk() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->usebottomk(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TopKLayerParams)
}